

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O2

Card ** cards_createDeck(uchar decksCount)

{
  ulong uVar1;
  Card **ppCVar2;
  Card *pCVar3;
  ulong uVar4;
  long lVar5;
  undefined7 in_register_00000039;
  uchar rank;
  Card **ppCVar6;
  
  uVar1 = CONCAT71(in_register_00000039,decksCount) & 0xffffffff;
  ppCVar2 = (Card **)malloc(uVar1 * 0x1a0);
  ppCVar6 = ppCVar2;
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    rank = '\x01';
    for (lVar5 = 0x18; lVar5 != 0x1b8; lVar5 = lVar5 + 0x20) {
      pCVar3 = card_create(rank,CLUB,true);
      *(Card **)((long)ppCVar6 + lVar5 + -0x18) = pCVar3;
      pCVar3 = card_create(rank,DIAMOND,true);
      *(Card **)((long)ppCVar6 + lVar5 + -0x10) = pCVar3;
      pCVar3 = card_create(rank,HEART,true);
      *(Card **)((long)ppCVar6 + lVar5 + -8) = pCVar3;
      pCVar3 = card_create(rank,SPADE,true);
      *(Card **)((long)ppCVar6 + lVar5) = pCVar3;
      rank = rank + '\x01';
    }
    ppCVar6 = ppCVar6 + 0x34;
  }
  return ppCVar2;
}

Assistant:

Card ** cards_createDeck(unsigned char decksCount)
{
	unsigned char i, d;
	Card ** cards = (Card **)malloc(sizeof(Card *)*(52*decksCount));

	for(d=0;d<decksCount;d++)
	{
		for(i=1;i<=13;i++)
		{
			cards[((i-1)*4)+(d*52)] = card_create(i, CLUB, true);
			cards[((i-1)*4)+1+(d*52)] = card_create(i, DIAMOND, true);
			cards[((i-1)*4)+2+(d*52)] = card_create(i, HEART, true);
			cards[((i-1)*4)+3+(d*52)] = card_create(i, SPADE, true);
		}
	}

	return cards;
}